

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O0

void forcingStep_PrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  int iVar1;
  FILE *in_RSI;
  int k;
  int retval;
  ARKodeForcingStepMem step_mem;
  ARKodeForcingStepMem *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  long lVar3;
  
  lVar3 = 0;
  iVar1 = forcingStep_AccessStepMem
                    ((ARKodeMem)0x0,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    for (uVar2 = 0; (int)uVar2 < 2; uVar2 = uVar2 + 1) {
      fprintf(in_RSI,"ForcingStep: partition %i: n_stepper_evolves = %li\n",(ulong)uVar2,
              *(undefined8 *)(lVar3 + 0x10 + (long)(int)uVar2 * 8));
    }
  }
  return;
}

Assistant:

static void forcingStep_PrintMem(ARKodeMem ark_mem, FILE* outfile)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* output long integer quantities */
  for (int k = 0; k < NUM_PARTITIONS; k++)
  {
    fprintf(outfile, "ForcingStep: partition %i: n_stepper_evolves = %li\n", k,
            step_mem->n_stepper_evolves[k]);
  }
}